

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

VkResult __thiscall
Diligent::CommandQueueVkImpl::Present(CommandQueueVkImpl *this,VkPresentInfoKHR *PresentInfo)

{
  VkResult VVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> QueueGuard;
  VkPresentInfoKHR *PresentInfo_local;
  CommandQueueVkImpl *this_local;
  
  QueueGuard._M_device = (mutex_type *)PresentInfo;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_QueueMutex);
  VVar1 = (*vkQueuePresentKHR)(this->m_VkQueue,(VkPresentInfoKHR *)QueueGuard._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return VVar1;
}

Assistant:

VkResult CommandQueueVkImpl::Present(const VkPresentInfoKHR& PresentInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};
    return vkQueuePresentKHR(m_VkQueue, &PresentInfo);
}